

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::FindLowestCeilingSurrounding(sector_t_conflict *this,vertex_t **v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ushort uVar4;
  line_t_conflict *plVar5;
  vertex_t *pvVar6;
  vertex_t *pvVar7;
  ulong uVar8;
  sector_t_conflict *psVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar4 = this->linecount;
  if ((ulong)uVar4 != 0) {
    pvVar7 = (*this->lines)->v1;
    dVar10 = 3.4028234663852886e+38;
    if (0 < (short)uVar4) {
      uVar8 = 0;
      do {
        plVar5 = this->lines[uVar8];
        if ((plVar5->flags & 4) == 0) {
          psVar9 = (sector_t_conflict *)0x0;
        }
        else {
          psVar9 = plVar5->frontsector;
          if (plVar5->frontsector == this) {
            psVar9 = (sector_t_conflict *)0x0;
            if (plVar5->backsector != this) {
              psVar9 = plVar5->backsector;
            }
          }
        }
        if (psVar9 != (sector_t_conflict *)0x0) {
          dVar1 = (psVar9->ceilingplane).D;
          dVar2 = (psVar9->ceilingplane).normal.X;
          dVar3 = (psVar9->ceilingplane).normal.Y;
          pvVar6 = plVar5->v1;
          dVar11 = (psVar9->ceilingplane).negiC;
          dVar12 = ((pvVar6->p).Y * dVar3 + (pvVar6->p).X * dVar2 + dVar1) * dVar11;
          if (dVar12 < dVar10) {
            pvVar7 = pvVar6;
          }
          pvVar6 = plVar5->v2;
          if (dVar10 <= dVar12) {
            dVar12 = dVar10;
          }
          dVar11 = (dVar3 * (pvVar6->p).Y + dVar2 * (pvVar6->p).X + dVar1) * dVar11;
          dVar10 = dVar12;
          if (dVar11 < dVar12) {
            pvVar7 = pvVar6;
            dVar10 = dVar11;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar7;
    }
    return dVar10;
  }
  return this->planes[1].TexZ;
}

Assistant:

double sector_t::FindLowestCeilingSurrounding (vertex_t **v) const
{
	double height;
	double oceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}